

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallExportGenerator::GenerateScriptConfigs
          (cmInstallExportGenerator *this,ostream *os,Indent *indent)

{
  cmExportInstallFileGenerator *pcVar1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  Indent local_74;
  string *local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string config_test;
  
  cmScriptGenerator::GenerateScriptConfigs((cmScriptGenerator *)this,os,indent);
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar1 = this->EFGen;
  p_Var3 = (pcVar1->ConfigImportFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_70 = &(this->super_cmInstallGenerator).Destination;
  while ((_Rb_tree_header *)p_Var3 !=
         &(pcVar1->ConfigImportFiles)._M_t._M_impl.super__Rb_tree_header) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&files,(value_type *)(p_Var3 + 2));
    cmScriptGenerator::CreateConfigTest
              (&config_test,(cmScriptGenerator *)this,(string *)(p_Var3 + 1));
    cmScriptGeneratorIndent::Write(indent,os);
    poVar2 = std::operator<<(os,"if(");
    poVar2 = std::operator<<(poVar2,(string *)&config_test);
    std::operator<<(poVar2,")\n");
    local_74.Level = indent->Level + 2;
    cmInstallGenerator::AddInstallRule
              (&this->super_cmInstallGenerator,os,local_70,cmInstallType_FILES,&files,false,
               (this->FilePermissions)._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0,
               &local_74);
    cmScriptGeneratorIndent::Write(indent,os);
    std::operator<<(os,"endif()\n");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&files);
    std::__cxx11::string::~string((string *)&config_test);
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    pcVar1 = this->EFGen;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&files);
  return;
}

Assistant:

void
cmInstallExportGenerator::GenerateScriptConfigs(std::ostream& os,
                                                Indent const& indent)
{
  // Create the main install rules first.
  this->cmInstallGenerator::GenerateScriptConfigs(os, indent);

  // Now create a configuration-specific install rule for the import
  // file of each configuration.
  std::vector<std::string> files;
  for(std::map<std::string, std::string>::const_iterator
        i = this->EFGen->GetConfigImportFiles().begin();
      i != this->EFGen->GetConfigImportFiles().end(); ++i)
    {
    files.push_back(i->second);
    std::string config_test = this->CreateConfigTest(i->first);
    os << indent << "if(" << config_test << ")\n";
    this->AddInstallRule(os, this->Destination,
                         cmInstallType_FILES, files, false,
                         this->FilePermissions.c_str(), 0, 0, 0,
                         indent.Next());
    os << indent << "endif()\n";
    files.clear();
    }
}